

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_address.cpp
# Opt level: O2

Address * __thiscall
cfd::api::AddressApi::CreateMultisig
          (Address *__return_storage_ptr__,AddressApi *this,NetType net_type,
          AddressType address_type,uint32_t req_sig_num,
          vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys,
          Script *redeem_script,Script *witness_script,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list)

{
  CfdException *this_00;
  allocator local_22d;
  AddressType address_type_local;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> addr_prefixes;
  Script multisig_script;
  Script script;
  char *local_1a0;
  WitnessVersion local_198;
  char *local_190;
  
  address_type_local = address_type;
  core::ScriptUtil::CreateMultisigRedeemScript(&multisig_script,req_sig_num,pubkeys,true);
  addr_prefixes.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  addr_prefixes.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addr_prefixes.
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (prefix_list ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    core::GetBitcoinAddressFormatList();
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    _M_move_assign(&addr_prefixes,
                   (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    *)&local_1a0);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &local_1a0);
  }
  else {
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&addr_prefixes,prefix_list);
  }
  core::Address::Address(__return_storage_ptr__);
  core::Script::Script(&script);
  if (address_type == kP2shP2wshAddress) {
    core::ScriptUtil::CreateP2wshLockingScript((Script *)&local_1a0,&multisig_script);
    core::Script::operator=(&script,(Script *)&local_1a0);
    core::Script::~Script((Script *)&local_1a0);
    core::Address::Address((Address *)&local_1a0,net_type,&script,&addr_prefixes);
    core::Address::operator=(__return_storage_ptr__,(Address *)&local_1a0);
    core::Address::~Address((Address *)&local_1a0);
    if (redeem_script != (Script *)0x0) {
      core::Script::operator=(redeem_script,&script);
    }
LAB_0033b27c:
    redeem_script = witness_script;
    if (witness_script == (Script *)0x0) goto LAB_0033b28e;
  }
  else {
    if (address_type == kP2wshAddress) {
      core::Address::Address
                ((Address *)&local_1a0,net_type,kVersion0,&multisig_script,&addr_prefixes);
      core::Address::operator=(__return_storage_ptr__,(Address *)&local_1a0);
      core::Address::~Address((Address *)&local_1a0);
      goto LAB_0033b27c;
    }
    if (address_type != kP2shAddress) {
      local_1a0 = "cfdapi_address.cpp";
      local_198 = 0xb1;
      local_190 = "CreateMultisig";
      core::logger::warn<cfd::core::AddressType&>
                ((CfdSourceLocation *)&local_1a0,
                 "Failed to CreateMultisig. Invalid address_type passed:  addressType={}",
                 &address_type_local);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_1a0,
                 "Invalid address_type. address_type must be \"p2sh\" \"p2wsh\" or \"p2sh-p2wsh\".",
                 &local_22d);
      core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_1a0);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Address::Address((Address *)&local_1a0,net_type,&multisig_script,&addr_prefixes);
    core::Address::operator=(__return_storage_ptr__,(Address *)&local_1a0);
    core::Address::~Address((Address *)&local_1a0);
    if (redeem_script == (Script *)0x0) goto LAB_0033b28e;
  }
  core::Script::operator=(redeem_script,&multisig_script);
LAB_0033b28e:
  core::Script::~Script(&script);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&addr_prefixes);
  core::Script::~Script(&multisig_script);
  return __return_storage_ptr__;
}

Assistant:

Address AddressApi::CreateMultisig(
    NetType net_type, AddressType address_type, uint32_t req_sig_num,
    const std::vector<Pubkey>& pubkeys, Script* redeem_script,
    Script* witness_script,
    const std::vector<AddressFormatData>* prefix_list) const {
  // Multisig redeem scriptの作成
  Script multisig_script =
      ScriptUtil::CreateMultisigRedeemScript(req_sig_num, pubkeys);

  std::vector<AddressFormatData> addr_prefixes;
  if (prefix_list == nullptr) {
    addr_prefixes = cfd::core::GetBitcoinAddressFormatList();
  } else {
    addr_prefixes = *prefix_list;
  }

  // Address作成
  Address addr;
  Script script;
  if (address_type == AddressType::kP2shAddress) {
    addr = Address(net_type, multisig_script, addr_prefixes);
    if (redeem_script != nullptr) {
      *redeem_script = multisig_script;
    }
  } else if (address_type == AddressType::kP2wshAddress) {
    // Currently we support only witness version 0.
    addr = Address(
        net_type, WitnessVersion::kVersion0, multisig_script, addr_prefixes);
    if (witness_script != nullptr) {
      *witness_script = multisig_script;
    }
  } else if (address_type == AddressType::kP2shP2wshAddress) {
    script = ScriptUtil::CreateP2wshLockingScript(multisig_script);
    addr = Address(net_type, script, addr_prefixes);
    if (redeem_script != nullptr) {
      *redeem_script = script;
    }
    if (witness_script != nullptr) {
      *witness_script = multisig_script;
    }
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        address_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2sh\" "
        "\"p2wsh\" or \"p2sh-p2wsh\".");  // NOLINT
  }
  return addr;
}